

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  MessageLite *pMVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_00f48472;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 10) {
        AddMessage();
      }
      this_01 = pEVar1->field_0;
      goto LAB_00f48455;
    }
LAB_00f48482:
    AddMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_00f4848a:
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x18);
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)(this_01.int64_t_value + 8) = 0;
    *(Arena **)(this_01.int64_t_value + 0x10) = (Arena *)0x0;
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_00f48472:
      AddMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_00f4847a:
      AddMessage();
      goto LAB_00f48482;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) goto LAB_00f4847a;
    pEVar1->is_repeated = true;
    pEVar1->field_0xa = pEVar1->field_0xa | 1;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00f4848a;
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)Arena::Allocate(this_00,0x18);
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)(this_01.int64_t_value + 8) = 0;
    *(Arena **)(this_01.int64_t_value + 0x10) = this_00;
  }
  (pEVar1->field_0).int64_t_value = (int64_t)this_01;
LAB_00f48455:
  pMVar2 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)this_01,prototype);
  return pMVar2;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}